

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

bool dxil_spv::get_constant_quad_lane(Value *lane,uint32_t *quad_lane)

{
  bool bVar1;
  BinaryOps BVar2;
  bool local_42;
  bool local_41;
  uint32_t local_40;
  byte local_3a;
  byte local_39;
  uint32_t secondary_quad_lane;
  bool rhs_is_wave_lane;
  bool lhs_is_wave_lane;
  Value *rhs;
  Value *lhs;
  BinaryOperator *binop;
  uint32_t *quad_lane_local;
  Value *lane_local;
  
  binop = (BinaryOperator *)quad_lane;
  quad_lane_local = (uint32_t *)lane;
  lhs = (Value *)LLVMBC::dyn_cast<LLVMBC::BinaryOperator>(lane);
  if ((BinaryOperator *)lhs == (BinaryOperator *)0x0) {
    return false;
  }
  rhs = LLVMBC::Instruction::getOperand((Instruction *)lhs,0);
  _secondary_quad_lane = LLVMBC::Instruction::getOperand((Instruction *)lhs,1);
  local_39 = value_is_wave_lane(rhs);
  local_3a = value_is_wave_lane(_secondary_quad_lane);
  local_40 = 0;
  BVar2 = LLVMBC::BinaryOperator::getOpcode((BinaryOperator *)lhs);
  if (BVar2 == Or) {
    bVar1 = get_constant_int(rhs,(uint32_t *)binop);
    if (((bVar1) && ((local_3a & 1) != 0)) ||
       (((local_39 & 1) != 0 &&
        (bVar1 = get_constant_int(_secondary_quad_lane,(uint32_t *)binop), bVar1)))) {
      return *(int *)&(binop->super_Instruction).super_Value.type == 3;
    }
    bVar1 = get_constant_int(rhs,(uint32_t *)binop);
    if (((bVar1) && (bVar1 = get_constant_quad_lane(_secondary_quad_lane,&local_40), bVar1)) ||
       ((bVar1 = get_constant_quad_lane(rhs,&local_40), bVar1 &&
        (bVar1 = get_constant_int(_secondary_quad_lane,(uint32_t *)binop), bVar1)))) {
      local_41 = *(uint *)&(binop->super_Instruction).super_Value.type < 4 && local_40 == 0;
      return local_41;
    }
  }
  else {
    BVar2 = LLVMBC::BinaryOperator::getOpcode((BinaryOperator *)lhs);
    if (BVar2 == And) {
      bVar1 = get_constant_int(rhs,(uint32_t *)binop);
      if ((((bVar1) && ((local_3a & 1) != 0)) ||
          (((local_39 & 1) != 0 &&
           (bVar1 = get_constant_int(_secondary_quad_lane,(uint32_t *)binop), bVar1)))) &&
         (*(int *)&(binop->super_Instruction).super_Value.type == -4)) {
        *(undefined4 *)&(binop->super_Instruction).super_Value.type = 0;
        return true;
      }
    }
    else {
      BVar2 = LLVMBC::BinaryOperator::getOpcode((BinaryOperator *)lhs);
      if ((BVar2 == Add) &&
         (((bVar1 = get_constant_int(rhs,(uint32_t *)binop), bVar1 &&
           (bVar1 = get_constant_quad_lane(_secondary_quad_lane,&local_40), bVar1)) ||
          ((bVar1 = get_constant_quad_lane(rhs,&local_40), bVar1 &&
           (bVar1 = get_constant_int(_secondary_quad_lane,(uint32_t *)binop), bVar1)))))) {
        local_42 = *(uint *)&(binop->super_Instruction).super_Value.type < 4 && local_40 == 0;
        return local_42;
      }
    }
  }
  return false;
}

Assistant:

static bool get_constant_quad_lane(const llvm::Value *lane, uint32_t *quad_lane)
{
	// Cases to consider:
	// - (gl_SubgroupInvocationID & ~3u) | C, where C is [0, 1, 2, 3].
	// - (gl_SubgroupInvocationID & ~3u) + C, where C is [0, 1, 2, 3].
	// - (gl_SubgroupInvocationID & ~3u) -> C = 0
	// - (gl_SubgroupInvocationID | 3u) -> C = 3
	auto *binop = llvm::dyn_cast<llvm::BinaryOperator>(lane);
	if (!binop)
		return false;

	auto *lhs = binop->getOperand(0);
	auto *rhs = binop->getOperand(1);
	bool lhs_is_wave_lane = value_is_wave_lane(lhs);
	bool rhs_is_wave_lane = value_is_wave_lane(rhs);
	uint32_t secondary_quad_lane = 0;

	if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Or)
	{
		if ((get_constant_int(lhs, quad_lane) && rhs_is_wave_lane) ||
		    (lhs_is_wave_lane && get_constant_int(rhs, quad_lane)))
		{
			// Case 3
			return *quad_lane == 3;
		}
		else if ((get_constant_int(lhs, quad_lane) && get_constant_quad_lane(rhs, &secondary_quad_lane)) ||
		         (get_constant_quad_lane(lhs, &secondary_quad_lane) && get_constant_int(rhs, quad_lane)))
		{
			// Case 0
			return *quad_lane < 4 && secondary_quad_lane == 0;
		}
	}
	else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::And)
	{
		if ((get_constant_int(lhs, quad_lane) && rhs_is_wave_lane) ||
		    (lhs_is_wave_lane && get_constant_int(rhs, quad_lane)))
		{
			// Case 2
			if (*quad_lane == ~3u)
			{
				*quad_lane = 0;
				return true;
			}
		}
	}
	else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Add)
	{
		if ((get_constant_int(lhs, quad_lane) && get_constant_quad_lane(rhs, &secondary_quad_lane)) ||
		    (get_constant_quad_lane(lhs, &secondary_quad_lane) && get_constant_int(rhs, quad_lane)))
		{
			// Case 0
			return *quad_lane < 4 && secondary_quad_lane == 0;
		}
	}

	return false;
}